

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::LinearDerivateCase::verify
          (LinearDerivateCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  Vec4 *v;
  Vec4 *pVVar1;
  Vec4 *pVVar2;
  ostringstream *poVar3;
  uint uVar4;
  int iVar5;
  Precision PVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  int iVar9;
  float fVar10;
  undefined7 extraout_var;
  undefined8 uVar11;
  undefined7 extraout_var_00;
  Vector<float,_4> *v_00;
  float fVar15;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  LogVecComps local_288;
  Vec4 valueRamp;
  Vec4 threshold;
  Vec4 reference;
  Vec4 opThreshold;
  Vec4 scale;
  Vector<float,_4> local_208;
  Vector<float,_4> local_1f8;
  Vec4 *local_1e0;
  Vec4 surfaceThreshold;
  Vector<float,_3> local_1c8;
  IVec2 viewportSize;
  Linear2DFunctionEvaluator function;
  
  local_1f8.m_data[0] = 1.0;
  local_1f8.m_data[1] = 0.0;
  local_1f8.m_data[2] = 0.5;
  local_1f8.m_data[3] = -0.5;
  local_208.m_data[0] = 0.0;
  local_208.m_data[1] = 1.0;
  local_208.m_data[2] = 0.5;
  local_208.m_data[3] = -0.5;
  TriangleDerivateCase::getSurfaceThreshold((TriangleDerivateCase *)&function);
  v = &(this->super_TriangleDerivateCase).m_derivScale;
  tcu::abs<float,4>((tcu *)&scale,v);
  tcu::operator/((tcu *)&surfaceThreshold,(Vector<float,_4> *)&function,(Vector<float,_4> *)&scale);
  uVar4 = *(uint *)&(this->super_TriangleDerivateCase).field_0xf4;
  iVar9 = *(int *)(ctx + 0xc);
  if (uVar4 < 2) {
    if (uVar4 == 0) {
      v_00 = &local_1f8;
      iVar9 = *(int *)(ctx + 8);
    }
    else {
      v_00 = &local_208;
    }
    tcu::Vector<float,_4>::Vector(&scale,v_00);
    pVVar1 = &(this->super_TriangleDerivateCase).m_coordMax;
    pVVar2 = &(this->super_TriangleDerivateCase).m_coordMin;
    tcu::operator-((tcu *)&opThreshold,pVVar1,pVVar2);
    tcu::operator/((tcu *)&function,(Vector<float,_4> *)&opThreshold,(float)iVar9);
    tcu::operator*((tcu *)&reference,(Vector<float,_4> *)&function,&scale);
    PVar6 = (this->super_TriangleDerivateCase).m_precision;
    local_1e0 = pVVar2;
    tcu::operator*((tcu *)&function,pVVar2,&scale);
    tcu::operator*((tcu *)&threshold,pVVar1,&scale);
    getDerivateThreshold((Functional *)&opThreshold,PVar6,(Vec4 *)&function,&threshold,&reference);
    tcu::max<float,4>((tcu *)&threshold,&surfaceThreshold,(Vector<float,_4> *)&opThreshold);
    fVar10 = (float)glu::getDataTypeFloatScalars((this->super_TriangleDerivateCase).m_dataType);
    function.matrix.m_data.m_data[0].m_data._0_8_ =
         ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
         ->m_log;
    poVar3 = (ostringstream *)(function.matrix.m_data.m_data[0].m_data + 2);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::operator<<((ostream *)poVar3,"Verifying result image.\n");
    std::operator<<((ostream *)poVar3,"\tValid derivative is ");
    valueRamp.m_data._0_8_ = &reference;
    valueRamp.m_data[2] = fVar10;
    tcu::MessageBuilder::operator<<((MessageBuilder *)&function,(LogVecComps *)&valueRamp);
    std::operator<<((ostream *)poVar3," with threshold ");
    local_288.v = &threshold;
    local_288.numComps = (int)fVar10;
    tcu::MessageBuilder::operator<<((MessageBuilder *)&function,&local_288);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&function,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    pVVar2 = &(this->super_TriangleDerivateCase).m_derivBias;
    bVar8 = verifyConstantDerivate
                      (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx)->m_log,(ConstPixelBufferAccess *)ctx,
                       (PixelBufferAccess *)sig,(this->super_TriangleDerivateCase).m_dataType,
                       &reference,&threshold,v,pVVar2,LOG_NOTHING);
    if (bVar8) {
      function.matrix.m_data.m_data[0].m_data._0_8_ =
           ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      poVar3 = (ostringstream *)(function.matrix.m_data.m_data[0].m_data + 2);
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::operator<<((ostream *)poVar3,"No incorrect derivatives found, result valid.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&function,(EndMessageToken *)&tcu::TestLog::EndMessage);
      uVar11 = std::__cxx11::ostringstream::~ostringstream(poVar3);
      iVar9 = (int)CONCAT71((int7)((ulong)uVar11 >> 8),1);
    }
    else {
      function.matrix.m_data.m_data[0].m_data._0_8_ =
           ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      poVar3 = (ostringstream *)(function.matrix.m_data.m_data[0].m_data + 2);
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::operator<<((ostream *)poVar3,
                      "Initial verification failed, verifying image by calculating accurate error bounds for each result pixel.\n"
                     );
      std::operator<<((ostream *)poVar3,
                      "\tVerifying each result derivative is within its range of legal result values."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&function,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      TriangleDerivateCase::getViewportSize((TriangleDerivateCase *)&viewportSize);
      fVar10 = (float)viewportSize.m_data[0];
      fVar15 = (float)viewportSize.m_data[1];
      tcu::operator-((tcu *)&valueRamp,pVVar1,local_1e0);
      tcu::Matrix<float,_4,_3>::Matrix(&function.matrix);
      local_288.numComps = (int)(this->super_TriangleDerivateCase).m_coordMin.m_data[0];
      local_288.v = (Vec4 *)(ulong)(uint)(valueRamp.m_data[0] / fVar10);
      tcu::Matrix<float,_4,_3>::setRow(&function.matrix,0,(Vector<float,_3> *)&local_288);
      local_288.numComps = (int)(this->super_TriangleDerivateCase).m_coordMin.m_data[1];
      local_288.v = (Vec4 *)((ulong)(uint)(valueRamp.m_data[1] / fVar15) << 0x20);
      tcu::Matrix<float,_4,_3>::setRow(&function.matrix,1,(Vector<float,_3> *)&local_288);
      local_1c8.m_data[2] = (this->super_TriangleDerivateCase).m_coordMin.m_data[2];
      local_1c8.m_data[2] = local_1c8.m_data[2] + local_1c8.m_data[2];
      auVar12._4_4_ = valueRamp.m_data[2];
      auVar12._0_4_ = valueRamp.m_data[2];
      auVar12._8_4_ = valueRamp.m_data[3];
      auVar12._12_4_ = valueRamp.m_data[3];
      auVar13._4_4_ = fVar15;
      auVar13._0_4_ = fVar10;
      auVar13._8_8_ = 0;
      auVar13 = divps(auVar12,auVar13);
      local_1c8.m_data._0_8_ = auVar13._0_8_;
      tcu::operator/((tcu *)&local_288,&local_1c8,2.0);
      tcu::Matrix<float,_4,_3>::setRow(&function.matrix,2,(Vector<float,_3> *)&local_288);
      local_1c8.m_data[2] = (this->super_TriangleDerivateCase).m_coordMax.m_data[3];
      local_1c8.m_data[2] = local_1c8.m_data[2] + local_1c8.m_data[2];
      auVar14._0_8_ = CONCAT44(valueRamp.m_data[3],valueRamp.m_data[3]) ^ 0x8000000080000000;
      auVar14._8_4_ = 0x80000000;
      auVar14._12_4_ = 0x80000000;
      auVar7._4_4_ = fVar15;
      auVar7._0_4_ = fVar10;
      auVar7._8_8_ = 0;
      auVar13 = divps(auVar14,auVar7);
      local_1c8.m_data._0_8_ = auVar13._0_8_;
      tcu::operator/((tcu *)&local_288,&local_1c8,2.0);
      tcu::Matrix<float,_4,_3>::setRow(&function.matrix,3,(Vector<float,_3> *)&local_288);
      bVar8 = reverifyConstantDerivateWithFlushRelaxations
                        (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx)->m_log,(ConstPixelBufferAccess *)ctx,
                         (PixelBufferAccess *)sig,(this->super_TriangleDerivateCase).m_dataType,
                         (this->super_TriangleDerivateCase).m_precision,v,pVVar2,&surfaceThreshold,
                         *(DerivateFunc *)&(this->super_TriangleDerivateCase).field_0xf4,
                         (Linear2DFunctionEvaluator *)&function.matrix);
      iVar9 = (int)CONCAT71(extraout_var_00,bVar8);
    }
  }
  else {
    iVar5 = *(int *)(ctx + 8);
    pVVar1 = &(this->super_TriangleDerivateCase).m_coordMax;
    pVVar2 = &(this->super_TriangleDerivateCase).m_coordMin;
    tcu::operator-((tcu *)&reference,pVVar1,pVVar2);
    tcu::operator/((tcu *)&scale,(Vector<float,_4> *)&reference,(float)iVar5);
    tcu::operator*((tcu *)&function,(Vector<float,_4> *)&scale,&local_1f8);
    tcu::operator-((tcu *)&opThreshold,pVVar1,pVVar2);
    tcu::operator/((tcu *)&reference,(Vector<float,_4> *)&opThreshold,(float)iVar9);
    tcu::operator*((tcu *)&scale,(Vector<float,_4> *)&reference,&local_208);
    tcu::abs<float,4>((tcu *)&opThreshold,(Vector<float,_4> *)&function);
    tcu::abs<float,4>((tcu *)&threshold,(Vector<float,_4> *)&scale);
    tcu::operator+((tcu *)&reference,(Vector<float,_4> *)&opThreshold,(Vector<float,_4> *)&threshold
                  );
    PVar6 = (this->super_TriangleDerivateCase).m_precision;
    tcu::operator*((tcu *)&threshold,pVVar2,&local_1f8);
    tcu::operator*((tcu *)&valueRamp,pVVar1,&local_1f8);
    getDerivateThreshold((Functional *)&opThreshold,PVar6,&threshold,&valueRamp,(Vec4 *)&function);
    PVar6 = (this->super_TriangleDerivateCase).m_precision;
    tcu::operator*((tcu *)&valueRamp,pVVar2,&local_208);
    tcu::operator*((tcu *)&local_288,pVVar1,&local_208);
    getDerivateThreshold((Functional *)&threshold,PVar6,&valueRamp,(Vec4 *)&local_288,&scale);
    tcu::max<float,4>((tcu *)&local_288,&opThreshold,(Vector<float,_4> *)&threshold);
    tcu::max<float,4>((tcu *)&valueRamp,&surfaceThreshold,(Vector<float,_4> *)&local_288);
    bVar8 = verifyConstantDerivate
                      (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx)->m_log,(ConstPixelBufferAccess *)ctx,
                       (PixelBufferAccess *)sig,(this->super_TriangleDerivateCase).m_dataType,
                       &reference,&valueRamp,v,&(this->super_TriangleDerivateCase).m_derivBias,
                       LOG_ALL);
    iVar9 = (int)CONCAT71(extraout_var,bVar8);
  }
  return iVar9;
}

Assistant:

bool LinearDerivateCase::verify (const tcu::ConstPixelBufferAccess& result, const tcu::PixelBufferAccess& errorMask)
{
	const tcu::Vec4		xScale				= tcu::Vec4(1.0f, 0.0f, 0.5f, -0.5f);
	const tcu::Vec4		yScale				= tcu::Vec4(0.0f, 1.0f, 0.5f, -0.5f);
	const tcu::Vec4		surfaceThreshold	= getSurfaceThreshold() / abs(m_derivScale);

	if (m_func == DERIVATE_DFDX || m_func == DERIVATE_DFDY)
	{
		const bool			isX			= m_func == DERIVATE_DFDX;
		const float			div			= isX ? float(result.getWidth()) : float(result.getHeight());
		const tcu::Vec4		scale		= isX ? xScale : yScale;
		const tcu::Vec4		reference	= ((m_coordMax - m_coordMin) / div) * scale;
		const tcu::Vec4		opThreshold	= getDerivateThreshold(m_precision, m_coordMin*scale, m_coordMax*scale, reference);
		const tcu::Vec4		threshold	= max(surfaceThreshold, opThreshold);
		const int			numComps	= glu::getDataTypeFloatScalars(m_dataType);

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying result image.\n"
			<< "\tValid derivative is " << LogVecComps(reference, numComps) << " with threshold " << LogVecComps(threshold, numComps)
			<< tcu::TestLog::EndMessage;

		// short circuit if result is strictly within the normal value error bounds.
		// This improves performance significantly.
		if (verifyConstantDerivate(m_testCtx.getLog(), result, errorMask, m_dataType,
								   reference, threshold, m_derivScale, m_derivBias,
								   LOG_NOTHING))
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "No incorrect derivatives found, result valid."
				<< tcu::TestLog::EndMessage;

			return true;
		}

		// some pixels exceed error bounds calculated for normal values. Verify that these
		// potentially invalid pixels are in fact valid due to (for example) subnorm flushing.

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Initial verification failed, verifying image by calculating accurate error bounds for each result pixel.\n"
			<< "\tVerifying each result derivative is within its range of legal result values."
			<< tcu::TestLog::EndMessage;

		{
			const tcu::IVec2			viewportSize	= getViewportSize();
			const float					w				= float(viewportSize.x());
			const float					h				= float(viewportSize.y());
			const tcu::Vec4				valueRamp		= (m_coordMax - m_coordMin);
			Linear2DFunctionEvaluator	function;

			function.matrix.setRow(0, tcu::Vec3(valueRamp.x() / w, 0.0f, m_coordMin.x()));
			function.matrix.setRow(1, tcu::Vec3(0.0f, valueRamp.y() / h, m_coordMin.y()));
			function.matrix.setRow(2, tcu::Vec3(valueRamp.z() / w, valueRamp.z() / h, m_coordMin.z() + m_coordMin.z()) / 2.0f);
			function.matrix.setRow(3, tcu::Vec3(-valueRamp.w() / w, -valueRamp.w() / h, m_coordMax.w() + m_coordMax.w()) / 2.0f);

			return reverifyConstantDerivateWithFlushRelaxations(m_testCtx.getLog(), result, errorMask,
																m_dataType, m_precision, m_derivScale,
																m_derivBias, surfaceThreshold, m_func,
																function);
		}
	}
	else
	{
		DE_ASSERT(m_func == DERIVATE_FWIDTH);
		const float			w			= float(result.getWidth());
		const float			h			= float(result.getHeight());

		const tcu::Vec4		dx			= ((m_coordMax - m_coordMin) / w) * xScale;
		const tcu::Vec4		dy			= ((m_coordMax - m_coordMin) / h) * yScale;
		const tcu::Vec4		reference	= tcu::abs(dx) + tcu::abs(dy);
		const tcu::Vec4		dxThreshold	= getDerivateThreshold(m_precision, m_coordMin*xScale, m_coordMax*xScale, dx);
		const tcu::Vec4		dyThreshold	= getDerivateThreshold(m_precision, m_coordMin*yScale, m_coordMax*yScale, dy);
		const tcu::Vec4		threshold	= max(surfaceThreshold, max(dxThreshold, dyThreshold));

		return verifyConstantDerivate(m_testCtx.getLog(), result, errorMask, m_dataType,
									  reference, threshold, m_derivScale, m_derivBias);
	}
}